

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillLeftAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Orientation OVar2;
  Node *local_28;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  local_28 = node;
  while (dVar1 = local_28->prev->point->x, edge->p->x <= dVar1 && dVar1 != edge->p->x) {
    OVar2 = Orient2d(edge->q,local_28->prev->point,edge->p);
    if (OVar2 == CW) {
      FillLeftBelowEdgeEvent(this,tcx,edge,local_28);
    }
    else {
      local_28 = local_28->prev;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->prev->point->x > edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->prev->point, *edge->p) == CW) {
      FillLeftBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->prev;
    }
  }
}